

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int libssh2_knownhost_del(LIBSSH2_KNOWNHOSTS *hosts,libssh2_knownhost *entry)

{
  known_host *entry_00;
  known_host *node;
  libssh2_knownhost *entry_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  if ((entry == (libssh2_knownhost *)0x0) || (entry->magic != 0xdeadcafe)) {
    hosts_local._4_4_ = _libssh2_error(hosts->session,-0x22,"Invalid host information");
  }
  else {
    entry_00 = (known_host *)entry->node;
    _libssh2_list_remove((list_node *)entry_00);
    memset(entry,0,0x28);
    free_host(hosts->session,entry_00);
    hosts_local._4_4_ = 0;
  }
  return hosts_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_del(LIBSSH2_KNOWNHOSTS *hosts,
                      struct libssh2_knownhost *entry)
{
    struct known_host *node;

    /* check that this was retrieved the right way or get out */
    if(!entry || (entry->magic != KNOWNHOST_MAGIC))
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                              "Invalid host information");

    /* get the internal node pointer */
    node = entry->node;

    /* unlink from the list of all hosts */
    _libssh2_list_remove(&node->node);

    /* clear the struct now since the memory in which it is allocated is
       about to be freed! */
    memset(entry, 0, sizeof(struct libssh2_knownhost));

    /* free all resources */
    free_host(hosts->session, node);

    return 0;
}